

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event::Replay
          (Event *this,AnyWriter *writer)

{
  StringPiece local_50;
  StringPiece local_40;
  StringPiece local_30;
  
  switch(this->type_) {
  case START_OBJECT:
    StringPiece::StringPiece<std::allocator<char>>(&local_50,&this->name_);
    StartObject(writer,local_50);
    break;
  case END_OBJECT:
    EndObject(writer);
    return;
  case START_LIST:
    StringPiece::StringPiece<std::allocator<char>>(&local_40,&this->name_);
    StartList(writer,local_40);
    break;
  case END_LIST:
    EndList(writer);
    return;
  case RENDER_DATA_PIECE:
    StringPiece::StringPiece<std::allocator<char>>(&local_30,&this->name_);
    RenderDataPiece(writer,local_30,&this->value_);
  }
  return;
}

Assistant:

void ProtoStreamObjectWriter::AnyWriter::Event::Replay(
    AnyWriter* writer) const {
  switch (type_) {
    case START_OBJECT:
      writer->StartObject(name_);
      break;
    case END_OBJECT:
      writer->EndObject();
      break;
    case START_LIST:
      writer->StartList(name_);
      break;
    case END_LIST:
      writer->EndList();
      break;
    case RENDER_DATA_PIECE:
      writer->RenderDataPiece(name_, value_);
      break;
  }
}